

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O2

string * sfi::logic::dotToDotDec(string *__return_storage_ptr__,string *str,int base)

{
  istream *piVar1;
  unsigned_long __val;
  exception e;
  string result;
  string octet;
  string local_1d0;
  istringstream stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)str,_S_in);
  octet._M_dataplus._M_p = (pointer)&octet.field_2;
  octet._M_string_length = 0;
  octet.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&result,"",(allocator *)&e);
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&octet,'.');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    __val = std::__cxx11::stoul(&octet,(size_t *)0x0,base);
    std::__cxx11::to_string(&local_1d0,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   &local_1d0,".");
    std::__cxx11::string::append((string *)&result);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&octet);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

static string sfi::logic::dotToDotDec(const string& str, int base){
    istringstream stream(str);
    string octet;
    string result{""};
    long oct;
    while(getline(stream,octet,'.')){
            try {
                oct = stoul(octet, nullptr, base);
            } catch (exception e){
                return "0";
            }
            result += to_string(oct) + ".";
    }
    return result.substr(0,result.length()-1);
}